

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

void parseTzLeapSeconds(QDataStream *ds,int tzh_leapcnt,bool longTran)

{
  long lVar1;
  Status SVar2;
  undefined1 in_DL;
  int in_ESI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  int i_1;
  int i;
  qint64 time;
  qint32 val;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar4;
  undefined3 in_stack_ffffffffffffffd8;
  uint uVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = CONCAT13(in_DL,in_stack_ffffffffffffffd8) & 0x1ffffff;
  if ((char)(uVar5 >> 0x18) == '\0') {
    iVar4 = 0;
    while( true ) {
      bVar3 = false;
      if (iVar4 < in_ESI) {
        SVar2 = QDataStream::status(in_RDI);
        bVar3 = SVar2 == Ok;
      }
      if (!bVar3) break;
      QDataStream::operator>>
                ((QDataStream *)CONCAT44(in_ESI,uVar5),
                 (qint32 *)CONCAT44(in_stack_ffffffffffffffd4,iVar4));
      SVar2 = QDataStream::status(in_RDI);
      if (SVar2 == Ok) {
        QDataStream::operator>>
                  ((QDataStream *)CONCAT44(in_ESI,uVar5),
                   (qint32 *)CONCAT44(in_stack_ffffffffffffffd4,iVar4));
      }
      iVar4 = iVar4 + 1;
    }
  }
  else {
    iVar4 = 0;
    while( true ) {
      bVar3 = false;
      if (iVar4 < in_ESI) {
        SVar2 = QDataStream::status(in_RDI);
        bVar3 = SVar2 == Ok;
      }
      if (!bVar3) break;
      QDataStream::operator>>
                ((QDataStream *)CONCAT44(in_ESI,uVar5),
                 (qint64 *)CONCAT44(iVar4,in_stack_ffffffffffffffd0));
      SVar2 = QDataStream::status(in_RDI);
      if (SVar2 == Ok) {
        QDataStream::operator>>
                  ((QDataStream *)CONCAT44(in_ESI,uVar5),
                   (qint32 *)CONCAT44(iVar4,in_stack_ffffffffffffffd0));
      }
      iVar4 = iVar4 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void parseTzLeapSeconds(QDataStream &ds, int tzh_leapcnt, bool longTran)
{
    // Parse tzh_leapcnt x pairs of leap seconds
    // We don't use leap seconds, so only read and don't store
    qint32 val;
    if (longTran) {
        // v2 file format, each entry is 12 bytes long
        qint64 time;
        for (int i = 0; i < tzh_leapcnt && ds.status() == QDataStream::Ok; ++i) {
            // Parse Leap Occurrence Time, 8 bytes
            ds >> time;
            // Parse Leap Seconds To Apply, 4 bytes
            if (ds.status() == QDataStream::Ok)
                ds >> val;
        }
    } else {
        // v0 file format, each entry is 8 bytes long
        for (int i = 0; i < tzh_leapcnt && ds.status() == QDataStream::Ok; ++i) {
            // Parse Leap Occurrence Time, 4 bytes
            ds >> val;
            // Parse Leap Seconds To Apply, 4 bytes
            if (ds.status() == QDataStream::Ok)
                ds >> val;
        }
    }
}